

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O2

void __thiscall InterpTest::Instantiate(InterpTest *this,RefVec *imports)

{
  Ref store;
  Ptr *in_R9;
  RefPtr<wabt::interp::Trap> trap;
  AssertHelper local_1b8;
  Message local_1b0;
  AssertionResult gtest_ar_;
  Ptr local_198;
  string local_170;
  ModuleDesc local_150;
  
  wabt::interp::ModuleDesc::ModuleDesc(&local_150,&this->module_desc_);
  wabt::interp::Module::New(&local_198,&this->store_,&local_150);
  (this->mod_).obj_ = local_198.obj_;
  (this->mod_).store_ = local_198.store_;
  (this->mod_).root_index_ = local_198.root_index_;
  local_198.obj_ = (Module *)0x0;
  local_198.store_ = (Store *)0x0;
  local_198.root_index_ = 0;
  wabt::interp::RefPtr<wabt::interp::Module>::reset(&local_198);
  wabt::interp::ModuleDesc::~ModuleDesc(&local_150);
  trap.obj_ = (Trap *)0x0;
  trap.store_ = (Store *)0x0;
  trap.root_index_ = 0;
  store = wabt::interp::RefPtr<wabt::interp::Module>::ref(&this->mod_);
  wabt::interp::Instance::Instantiate
            ((Ptr *)&local_198,(Instance *)&this->store_,(Store *)store.index,(Ref)imports,
             (RefVec *)&trap,in_R9);
  (this->inst_).obj_ = (Instance *)local_198.obj_;
  (this->inst_).store_ = local_198.store_;
  (this->inst_).root_index_ = local_198.root_index_;
  local_198.obj_ = (Module *)0x0;
  local_198.store_ = (Store *)0x0;
  local_198.root_index_ = 0;
  wabt::interp::RefPtr<wabt::interp::Instance>::reset((RefPtr<wabt::interp::Instance> *)&local_198);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = (this->inst_).obj_ != (Instance *)0x0;
  if (!gtest_ar_.success_) {
    testing::Message::Message(&local_1b0);
    std::__cxx11::string::string((string *)&local_198,(string *)&(trap.obj_)->message_);
    std::operator<<((ostream *)
                    ((long)local_1b0.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl + 0x10),(string *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)&gtest_ar_,(AssertionResult *)"inst_","false","true",
               (char *)in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-interp.cc"
               ,0x2b,local_170._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    if (local_1b0.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_1b0.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  wabt::interp::RefPtr<wabt::interp::Trap>::reset(&trap);
  return;
}

Assistant:

void Instantiate(const RefVec& imports = RefVec{}) {
    mod_ = Module::New(store_, module_desc_);
    RefPtr<Trap> trap;
    inst_ = Instance::Instantiate(store_, mod_.ref(), imports, &trap);
    ASSERT_TRUE(inst_) << trap->message();
  }